

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmr.cpp
# Opt level: O0

void __thiscall DSDcc::DSDDMR::DSDDMR(DSDDMR *this,DSDDecoder *dsdDecoder)

{
  long in_RSI;
  long *in_RDI;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 2;
  *(undefined1 *)(in_RDI + 3) = 0;
  *(undefined1 *)((long)in_RDI + 0x19) = 0;
  *(undefined1 *)((long)in_RDI + 0x1a) = 0;
  *(undefined1 *)((long)in_RDI + 0x1b) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0xd;
  *(undefined4 *)((long)in_RDI + 0xe4) = 0;
  *(undefined1 *)(in_RDI + 0x1d) = 0;
  DMRAddresses::DMRAddresses((DMRAddresses *)((long)in_RDI + 0xec));
  *(undefined4 *)(in_RDI + 0x2f) = 0;
  *(undefined1 *)((long)in_RDI + 0x17c) = 0;
  DMRAddresses::DMRAddresses((DMRAddresses *)(in_RDI + 0x30));
  *(undefined4 *)((long)in_RDI + 0x1a4) = 6;
  *(undefined4 *)(in_RDI + 0x35) = 6;
  Hamming_7_4::Hamming_7_4((Hamming_7_4 *)0x1192ec);
  Golay_20_8::Golay_20_8((Golay_20_8 *)0x119302);
  QR_16_7_6::QR_16_7_6((QR_16_7_6 *)0x11931a);
  Hamming_16_11_4::Hamming_16_11_4((Hamming_16_11_4 *)0x11932d);
  in_RDI[4] = *in_RDI + 0x2258;
  in_RDI[0x6bc] = 0;
  in_RDI[0x6bd] = 0;
  in_RDI[0x6be] = 0;
  in_RDI[0x6bf] = 0;
  memset(in_RDI + 5,0,10);
  memset((void *)((long)in_RDI + 0x32),0,0x18);
  memset((void *)((long)in_RDI + 0x4a),0,8);
  memset((void *)((long)in_RDI + 0x52),0,0x10);
  memset((void *)((long)in_RDI + 0x62),0,0x80);
  memset(in_RDI + 0x1f,0,0x80);
  memset((void *)((long)in_RDI + 0x18c),0,0x18);
  memset((void *)((long)in_RDI + 0x1ac),0,9);
  return;
}

Assistant:

DSDDMR::DSDDMR(DSDDecoder *dsdDecoder) :
        m_dsdDecoder(dsdDecoder),
        m_symbolIndex(0),
        m_cachSymbolIndex(0),
        m_burstType(DSDDMRBurstNone),
        m_slot(DSDDMRSlotUndefined),
        m_continuation(false),
        m_cachOK(false),
        m_lcss(SingleLC_FirstCSBK),
        m_colorCode(0),
        m_dataType(DSDDMRDataUnknown),
        m_voice1EmbSig_dibitsIndex(0),
        m_voice1EmbSig_OK(false),
        m_voice2EmbSig_dibitsIndex(0),
        m_voice2EmbSig_OK(false),
        m_voice1FrameCount(DMR_VOX_SUPERFRAME_LEN),
        m_voice2FrameCount(DMR_VOX_SUPERFRAME_LEN)
{
    m_slotText = m_dsdDecoder->m_state.slot0light;
    w = 0;
    x = 0;
    y = 0;
    z = 0;

    memset(m_slotTypePDU_dibits, 0, 10);
    memset(m_cachBits, 0, 24);
    memset(m_emb_dibits, 0, 8);
    memset(m_voiceEmbSig_dibits, 0, 16);
    memset(m_voice1EmbSigRawBits, 0, 16*8);
    memset(m_voice2EmbSigRawBits, 0, 16*8);
    memset(m_syncDibits, 0, 24);
    memset(m_mbeDVFrame, 0, 9);
}